

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

int nn_trie_subscribe(nn_trie *self,uint8_t *data,size_t size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  int iVar5;
  int index;
  long lVar6;
  nn_trie_node *pnVar7;
  nn_trie_node **ppnVar8;
  nn_trie_node **__src;
  nn_trie_node *pnVar9;
  size_t in_RDX;
  byte *in_RSI;
  nn_trie_node **in_RDI;
  int more_nodes;
  int inserted;
  int new_children;
  int old_children;
  uint8_t new_max;
  uint8_t new_min;
  uint8_t c2;
  uint8_t c;
  int pos;
  nn_trie_node *old_node;
  nn_trie_node *ch;
  nn_trie_node **n;
  nn_trie_node **node;
  int i;
  nn_trie_node *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint local_80;
  uint local_7c;
  uint local_68;
  uint local_64;
  byte local_48;
  byte local_47;
  nn_trie_node **local_28;
  uint local_1c;
  size_t local_18;
  byte *local_10;
  
  local_28 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    if (*local_28 == (nn_trie_node *)0x0) {
LAB_003012eb:
      while( true ) {
        pnVar9 = (nn_trie_node *)nn_alloc_(0x30131d);
        *local_28 = pnVar9;
        (*local_28)->refcount = 0;
        (*local_28)->type = 10 < local_18;
        if (local_18 < 10) {
          uVar4 = (uint8_t)local_18;
        }
        else {
          uVar4 = '\n';
        }
        (*local_28)->prefix_len = uVar4;
        memcpy((*local_28)->prefix,local_10,(ulong)(*local_28)->prefix_len);
        bVar2 = (*local_28)->prefix_len;
        bVar3 = (*local_28)->prefix_len;
        if (10 >= local_18) break;
        ((*local_28)->u).sparse.children[0] = local_10[(int)(uint)bVar2];
        local_28 = nn_node_child(*local_28,0);
        local_10 = local_10 + (int)(uint)bVar2 + 1;
        local_18 = (local_18 - bVar3) - 1;
      }
LAB_00301457:
      (*local_28)->refcount = (*local_28)->refcount + 1;
      return (uint)((*local_28)->refcount == 1);
    }
    iVar5 = nn_node_check_prefix(*local_28,local_10,local_18);
    local_10 = local_10 + iVar5;
    lVar6 = local_18 - (long)iVar5;
    if (iVar5 < (int)(uint)(*local_28)->prefix_len) {
      pnVar9 = *local_28;
      pnVar7 = (nn_trie_node *)nn_alloc_(0x300c18);
      *local_28 = pnVar7;
      (*local_28)->refcount = 0;
      (*local_28)->prefix_len = (uint8_t)iVar5;
      (*local_28)->type = '\x01';
      memcpy((*local_28)->prefix,pnVar9->prefix,(long)iVar5);
      ((*local_28)->u).sparse.children[0] = pnVar9->prefix[iVar5];
      pnVar9->prefix_len = pnVar9->prefix_len - ((uint8_t)iVar5 + '\x01');
      memmove(pnVar9->prefix,pnVar9->prefix + (long)iVar5 + 1,(ulong)pnVar9->prefix_len);
      pnVar9 = nn_node_compact(in_stack_ffffffffffffff68);
      ppnVar8 = nn_node_child(*local_28,0);
      *ppnVar8 = pnVar9;
LAB_00300cf9:
      if (lVar6 == 0) goto LAB_00301457;
      if ((*local_28)->type < 8) {
        pnVar9 = (nn_trie_node *)
                 nn_realloc((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (size_t)in_stack_ffffffffffffff68);
        *local_28 = pnVar9;
        (*local_28)->prefix[(ulong)(*local_28)->type + 10] = *local_10;
        (*local_28)->type = (*local_28)->type + '\x01';
        local_28 = nn_node_child(*local_28,(*local_28)->type - 1);
        *local_28 = (nn_trie_node *)0x0;
        local_10 = local_10 + 1;
        local_18 = lVar6 - 1;
      }
      else if ((*local_28)->type == '\t') {
        bVar2 = *local_10;
        if ((bVar2 < ((*local_28)->u).sparse.children[0]) ||
           (((*local_28)->u).sparse.children[1] < bVar2)) {
          bVar3 = bVar2;
          if (((*local_28)->u).sparse.children[0] < bVar2) {
            bVar3 = ((*local_28)->u).sparse.children[0];
          }
          local_64 = (uint)bVar3;
          bVar1 = bVar2;
          if (bVar2 < ((*local_28)->u).sparse.children[1]) {
            bVar1 = ((*local_28)->u).sparse.children[1];
          }
          local_68 = (uint)bVar1;
          pnVar9 = (nn_trie_node *)
                   nn_realloc((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (size_t)in_stack_ffffffffffffff68);
          *local_28 = pnVar9;
          iVar5 = ((uint)((*local_28)->u).sparse.children[1] -
                  (uint)((*local_28)->u).sparse.children[0]) + 1;
          if (((*local_28)->u).sparse.children[0] == bVar3) {
            ppnVar8 = nn_node_child(*local_28,iVar5);
            memset(ppnVar8,0,(long)(int)(((local_68 - local_64) + 1) - iVar5) << 3);
          }
          else {
            index = ((*local_28)->u).sparse.children[0] - local_64;
            ppnVar8 = nn_node_child(*local_28,index);
            __src = nn_node_child(*local_28,0);
            memmove(ppnVar8,__src,(long)iVar5 << 3);
            ppnVar8 = nn_node_child(*local_28,0);
            memset(ppnVar8,0,(long)index << 3);
          }
          ((*local_28)->u).sparse.children[0] = bVar3;
          ((*local_28)->u).sparse.children[1] = bVar1;
        }
        ((*local_28)->u).dense.nbr = ((*local_28)->u).dense.nbr + 1;
        local_28 = nn_node_child(*local_28,(uint)bVar2 - (uint)((*local_28)->u).sparse.children[0]);
        local_10 = local_10 + 1;
        local_18 = lVar6 - 1;
      }
      else {
        local_47 = 0xff;
        local_48 = 0;
        for (local_1c = 0; local_1c != (*local_28)->type; local_1c = local_1c + 1) {
          bVar2 = (*local_28)->prefix[(long)(int)local_1c + 10];
          bVar3 = bVar2;
          if (local_47 < bVar2) {
            bVar3 = local_47;
          }
          local_47 = bVar3;
          if (bVar2 < local_48) {
            bVar2 = local_48;
          }
          local_48 = bVar2;
        }
        if (*local_10 <= local_47) {
          local_47 = *local_10;
        }
        local_7c = (uint)local_47;
        if (local_48 <= *local_10) {
          local_48 = *local_10;
        }
        local_80 = (uint)local_48;
        pnVar9 = *local_28;
        pnVar7 = (nn_trie_node *)nn_alloc_(0x301174);
        *local_28 = pnVar7;
        (*local_28)->refcount = 0;
        (*local_28)->prefix_len = pnVar9->prefix_len;
        (*local_28)->type = '\t';
        memcpy((*local_28)->prefix,pnVar9->prefix,(ulong)pnVar9->prefix_len);
        ((*local_28)->u).sparse.children[0] = local_47;
        ((*local_28)->u).sparse.children[1] = local_48;
        ((*local_28)->u).dense.nbr = pnVar9->type + 1;
        memset(*local_28 + 1,0,(long)(int)((local_80 - local_7c) + 1) << 3);
        for (local_1c = 0; local_1c != pnVar9->type; local_1c = local_1c + 1) {
          ppnVar8 = nn_node_child(pnVar9,local_1c);
          pnVar7 = *ppnVar8;
          ppnVar8 = nn_node_child(*local_28,pnVar9->prefix[(long)(int)local_1c + 10] - local_7c);
          *ppnVar8 = pnVar7;
        }
        local_28 = nn_node_next(in_stack_ffffffffffffff68,'\0');
        local_10 = local_10 + 1;
        local_18 = lVar6 - 1;
        nn_free((void *)0x3012e9);
      }
      goto LAB_003012eb;
    }
    if (lVar6 == 0) goto LAB_00301457;
    ppnVar8 = nn_node_next(in_stack_ffffffffffffff68,'\0');
    if ((ppnVar8 == (nn_trie_node **)0x0) || (*ppnVar8 == (nn_trie_node *)0x0)) goto LAB_00300cf9;
    local_10 = local_10 + 1;
    local_18 = lVar6 - 1;
    local_28 = ppnVar8;
  } while( true );
}

Assistant:

int nn_trie_subscribe (struct nn_trie *self, const uint8_t *data, size_t size)
{
    int i;
    struct nn_trie_node **node;
    struct nn_trie_node **n;
    struct nn_trie_node *ch;
    struct nn_trie_node *old_node;
    int pos;
    uint8_t c;
    uint8_t c2;
    uint8_t new_min;
    uint8_t new_max;
    int old_children;
    int new_children;
    int inserted;
    int more_nodes;

    /*  Step 1 -- Traverse the trie. */

    node = &self->root;
    while (1) {

        /*  If there are no more nodes on the path, go to step 4. */
        if (!*node)
            goto step4;

        /*  Check whether prefix matches the new subscription. */
        pos = nn_node_check_prefix (*node, data, size);
        data += pos;
        size -= pos;

        /*  If only part of the prefix matches, go to step 2. */
        if (pos < (*node)->prefix_len)
            goto step2;

        /*  Even if whole prefix matches and there's no more data to match,
            go directly to step 5. */
        if (!size)
            goto step5;

        /*  Move to the next node. If it is not present, go to step 3. */
        n = nn_node_next (*node, *data);
        if (!n || !*n)
            goto step3;
        node = n;
        ++data;
        --size;
    }

    /*  Step 2 -- Split the prefix into two parts if required. */
step2:

    ch = *node;
    *node = nn_alloc (sizeof (struct nn_trie_node) +
        sizeof (struct nn_trie_node*), "trie node");
    assert (*node);
    (*node)->refcount = 0;
    (*node)->prefix_len = pos;
    (*node)->type = 1;
    memcpy ((*node)->prefix, ch->prefix, pos);
    (*node)->u.sparse.children [0] = ch->prefix [pos];
    ch->prefix_len -= (pos + 1);
    memmove (ch->prefix, ch->prefix + pos + 1, ch->prefix_len);
    ch = nn_node_compact (ch);
    *nn_node_child (*node, 0) = ch;

    /*  Step 3 -- Adjust the child array to accommodate the new character. */
step3:

    /*  If there are no more data in the subscription, there's nothing to
        adjust in the child array. Proceed directly to the step 5. */
    if (!size)
        goto step5;

    /*  If the new branch fits into sparse array... */
    if ((*node)->type < NN_TRIE_SPARSE_MAX) {
        *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
            ((*node)->type + 1) * sizeof (struct nn_trie_node*));
        assert (*node);
        (*node)->u.sparse.children [(*node)->type] = *data;
        ++(*node)->type;
        node = nn_node_child (*node, (*node)->type - 1);
        *node = NULL;
        ++data;
        --size;
        goto step4;
    }

    /*  If the node is already a dense array, resize it to fit the next
        character. */
    if ((*node)->type == NN_TRIE_DENSE_TYPE) {
        c = *data;
        if (c < (*node)->u.dense.min || c > (*node)->u.dense.max) {
            new_min = (*node)->u.dense.min < c ? (*node)->u.dense.min : c;
            new_max = (*node)->u.dense.max > c ? (*node)->u.dense.max : c;
            *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
                (new_max - new_min + 1) * sizeof (struct nn_trie_node*));
            assert (*node);
            old_children = (*node)->u.dense.max - (*node)->u.dense.min + 1;
            new_children = new_max - new_min + 1;
            if ((*node)->u.dense.min != new_min) {
                inserted = (*node)->u.dense.min - new_min;
                memmove (nn_node_child (*node, inserted),
                    nn_node_child (*node, 0),
                    old_children * sizeof (struct nn_trie_node*));
                memset (nn_node_child (*node, 0), 0,
                    inserted * sizeof (struct nn_trie_node*));
            }
            else {
                memset (nn_node_child (*node, old_children), 0,
                    (new_children - old_children) *
                    sizeof (struct nn_trie_node*));
            }
            (*node)->u.dense.min = new_min;
            (*node)->u.dense.max = new_max;
        }
        ++(*node)->u.dense.nbr;

        node = nn_node_child (*node, c - (*node)->u.dense.min);
        ++data;
        --size;
        goto step4;
    }

    /*  This is a sparse array, but no more children can be added to it.
        We have to convert it into a dense array. */
    {
        /*  First, determine the range of children. */
        new_min = 255;
        new_max = 0;
        for (i = 0; i != (*node)->type; ++i) {
            c2 = (*node)->u.sparse.children [i];
            new_min = new_min < c2 ? new_min : c2;
            new_max = new_max > c2 ? new_max : c2;
        }
        new_min = new_min < *data ? new_min : *data;
        new_max = new_max > *data ? new_max : *data;

        /*  Create a new mode, while keeping the old one for a while. */
        old_node = *node;
        *node = (struct nn_trie_node*) nn_alloc (sizeof (struct nn_trie_node) +
            (new_max - new_min + 1) * sizeof (struct nn_trie_node*),
            "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->prefix_len = old_node->prefix_len;
        (*node)->type = NN_TRIE_DENSE_TYPE;
        memcpy ((*node)->prefix, old_node->prefix, old_node->prefix_len);
        (*node)->u.dense.min = new_min;
        (*node)->u.dense.max = new_max;
        (*node)->u.dense.nbr = old_node->type + 1;
        memset (*node + 1, 0, (new_max - new_min + 1) *
            sizeof (struct nn_trie_node*));
        for (i = 0; i != old_node->type; ++i)
            *nn_node_child (*node, old_node->u.sparse.children [i] - new_min) =
                *nn_node_child (old_node, i);
        node = nn_node_next (*node, *data);
        ++data;
        --size;

        /*  Get rid of the obsolete old node. */
        nn_free (old_node);
    }

    /*  Step 4 -- Create new nodes for remaining part of the subscription. */
step4:

    assert (!*node);
    while (1) {

        /*  Create a new node to hold the next part of the subscription. */
        more_nodes = size > NN_TRIE_PREFIX_MAX;
        *node = nn_alloc (sizeof (struct nn_trie_node) +
            (more_nodes ? sizeof (struct nn_trie_node*) : 0), "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->type = more_nodes ? 1 : 0;
        (*node)->prefix_len = size < (uint8_t) NN_TRIE_PREFIX_MAX ?
            (uint8_t) size : (uint8_t) NN_TRIE_PREFIX_MAX;
        memcpy ((*node)->prefix, data, (*node)->prefix_len);
        data += (*node)->prefix_len;
        size -= (*node)->prefix_len;
        if (!more_nodes)
            break;
        (*node)->u.sparse.children [0] = *data;
        node = nn_node_child (*node, 0);
        ++data;
        --size;
    }

    /*  Step 5 -- Create the subscription as such. */
step5:

    ++(*node)->refcount;

    /*  Return 1 in case of a fresh subscription. */
    return (*node)->refcount == 1 ? 1 : 0;
}